

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusmenuregistrarproxy_p.cpp
# Opt level: O0

void QDBusMenuRegistrarInterface::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QDBusReply<QString> *other;
  QMetaType QVar1;
  long *in_RCX;
  uint in_EDX;
  int in_ESI;
  QDBusReply<QString> *in_RDI;
  long in_FS_OFFSET;
  QDBusMenuRegistrarInterface *_t;
  QDBusPendingReply<> _r_3;
  QDBusPendingReply<> _r_2;
  QDBusReply<QString> _r_1;
  QDBusPendingReply<QString,_QDBusObjectPath> _r;
  QDBusReply<QString> *this;
  QDBusObjectPath *in_stack_ffffffffffffff70;
  QMetaType in_stack_ffffffffffffff78;
  QMetaType local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 local_68 [68];
  uint in_stack_ffffffffffffffdc;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    other = (QDBusReply<QString> *)(ulong)in_EDX;
    switch(other) {
    case (QDBusReply<QString> *)0x0:
      GetMenuForWindow((QDBusMenuRegistrarInterface *)in_stack_ffffffffffffff78.d_ptr,
                       in_stack_ffffffffffffffdc);
      if (*in_RCX != 0) {
        QDBusPendingReply<QString,_QDBusObjectPath>::operator=
                  ((QDBusPendingReply<QString,_QDBusObjectPath> *)in_RDI,
                   (QDBusPendingReply<QString,_QDBusObjectPath> *)other);
      }
      QDBusPendingReply<QString,_QDBusObjectPath>::~QDBusPendingReply
                ((QDBusPendingReply<QString,_QDBusObjectPath> *)0xaf3c73);
      break;
    case (QDBusReply<QString> *)0x1:
      this = in_RDI;
      memset(local_68,0xaa,0x58);
      GetMenuForWindow((QDBusMenuRegistrarInterface *)this,(uint)((ulong)lVar2 >> 0x20),
                       (QDBusObjectPath *)CONCAT44(in_ESI,in_EDX));
      if (*in_RCX != 0) {
        QDBusReply<QString>::operator=(in_RDI,other);
      }
      QDBusReply<QString>::~QDBusReply(in_RDI);
      break;
    case (QDBusReply<QString> *)0x2:
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      RegisterWindow((QDBusMenuRegistrarInterface *)in_stack_ffffffffffffff78.d_ptr,
                     in_stack_ffffffffffffffdc,in_stack_ffffffffffffff70);
      if (*in_RCX != 0) {
        QDBusPendingReply<>::operator=((QDBusPendingReply<> *)in_RDI,(QDBusPendingReply<> *)other);
      }
      QDBusPendingReply<>::~QDBusPendingReply((QDBusPendingReply<> *)0xaf3d31);
      break;
    case (QDBusReply<QString> *)0x3:
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      UnregisterWindow((QDBusMenuRegistrarInterface *)in_stack_ffffffffffffff78.d_ptr,
                       in_stack_ffffffffffffffdc);
      if (*in_RCX != 0) {
        QDBusPendingReply<>::operator=((QDBusPendingReply<> *)in_RDI,(QDBusPendingReply<> *)other);
      }
      QDBusPendingReply<>::~QDBusPendingReply((QDBusPendingReply<> *)0xaf3d80);
    }
  }
  if (in_ESI == 7) {
    if (in_EDX == 2) {
      if (*(int *)in_RCX[1] == 1) {
        QVar1 = QMetaType::fromType<QDBusObjectPath>();
        *(QMetaTypeInterface **)*in_RCX = QVar1.d_ptr;
      }
      else {
        memset(&stack0xffffffffffffff78,0,8);
        QMetaType::QMetaType((QMetaType *)&stack0xffffffffffffff78);
        *(QMetaTypeInterface **)*in_RCX = in_stack_ffffffffffffff78.d_ptr;
      }
    }
    else {
      memset(&local_80,0,8);
      QMetaType::QMetaType(&local_80);
      *(QMetaTypeInterface **)*in_RCX = local_80.d_ptr;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDBusMenuRegistrarInterface::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDBusMenuRegistrarInterface *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: { QDBusPendingReply<QString,QDBusObjectPath> _r = _t->GetMenuForWindow((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<QString,QDBusObjectPath>*>(_a[0]) = std::move(_r); }  break;
        case 1: { QDBusReply<QString> _r = _t->GetMenuForWindow((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDBusObjectPath&>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QDBusReply<QString>*>(_a[0]) = std::move(_r); }  break;
        case 2: { QDBusPendingReply<> _r = _t->RegisterWindow((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDBusObjectPath>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<>*>(_a[0]) = std::move(_r); }  break;
        case 3: { QDBusPendingReply<> _r = _t->UnregisterWindow((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<>*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusObjectPath >(); break;
            }
            break;
        }
    }
}